

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.c
# Opt level: O1

int wally_hash160(uchar *bytes,size_t bytes_len,uchar *bytes_out,size_t len)

{
  int iVar1;
  uchar buff [32];
  sha256 sStack_38;
  
  iVar1 = -2;
  if ((len == 0x14 && bytes_out != (uchar *)0x0) && (bytes != (uchar *)0x0 || bytes_len == 0)) {
    sha256(&sStack_38,bytes,bytes_len);
    ripemd160((ripemd160 *)bytes_out,&sStack_38,0x20);
    (*_ops.bzero_fn)(&sStack_38,0x20);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int wally_hash160(const unsigned char *bytes, size_t bytes_len,
                  unsigned char *bytes_out, size_t len)
{
    unsigned char buff[SHA256_LEN];
    struct ripemd160 ripemd;
    const bool aligned = alignment_ok(bytes_out, sizeof(ripemd.u.u32));

    if (!bytes_out || len != HASH160_LEN)
        return WALLY_EINVAL;

    BUILD_ASSERT(sizeof(ripemd) == HASH160_LEN);

    if (wally_sha256(bytes, bytes_len, buff, sizeof(buff)) != WALLY_OK)
        return WALLY_EINVAL;

    ripemd160(aligned ? (struct ripemd160 *)bytes_out : &ripemd, &buff, sizeof(buff));
    if (!aligned) {
        memcpy(bytes_out, &ripemd, sizeof(ripemd));
        wally_clear(&ripemd, sizeof(ripemd));
    }
    wally_clear(&buff, sizeof(buff));
    return WALLY_OK;
}